

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePathCommand.cxx
# Opt level: O2

bool anon_unknown.dwarf_ea2049::HandleGetCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  pointer pbVar1;
  pointer pbVar2;
  bool bVar3;
  bool bVar4;
  ulong uVar5;
  uint val;
  ulong uVar6;
  string *name;
  long lVar7;
  string_view value_00;
  string_view value_01;
  uint local_10c;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  varArgsExpanded;
  cmAlphaNum local_e0;
  string local_b0;
  size_t nitem;
  string value;
  unsigned_long local_68;
  cmAlphaNum local_60;
  
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if ((ulong)((long)pbVar2 - (long)pbVar1) < 0x80) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_e0,"sub-command GET requires at least three arguments.",
               (allocator<char> *)&local_60);
    std::__cxx11::string::_M_assign((string *)&status->Error);
    std::__cxx11::string::~string((string *)&local_e0);
    bVar3 = false;
  }
  else {
    varArgsExpanded.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    varArgsExpanded.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    varArgsExpanded.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bVar3 = GetList(&varArgsExpanded,pbVar1 + 1,status->Makefile);
    name = pbVar2 + -1;
    if (bVar3) {
      if (varArgsExpanded.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          varArgsExpanded.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_e0,"GET given empty list",(allocator<char> *)&local_60);
        std::__cxx11::string::_M_assign((string *)&status->Error);
        std::__cxx11::string::~string((string *)&local_e0);
        bVar3 = false;
      }
      else {
        value._M_dataplus._M_p = (pointer)&value.field_2;
        value._M_string_length = 0;
        value.field_2._M_local_buf[0] = '\0';
        uVar6 = (long)varArgsExpanded.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)varArgsExpanded.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 5;
        uVar5 = 2;
        lVar7 = 0x40;
        nitem = uVar6;
        while( true ) {
          pbVar1 = (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          bVar3 = ((long)(args->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) - 1U <=
                  uVar5;
          if (bVar3) break;
          bVar4 = GetIndexArg((string *)((long)&(pbVar1->_M_dataplus)._M_p + lVar7),
                              (int *)&local_10c,status->Makefile);
          if (!bVar4) {
            local_e0.View_._M_len = 7;
            local_e0.View_._M_str = "index: ";
            pbVar1 = (args->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            local_60.View_._M_str = *(char **)((long)&(pbVar1->_M_dataplus)._M_p + lVar7);
            local_60.View_._M_len = *(size_t *)((long)&pbVar1->_M_string_length + lVar7);
            cmStrCat<char[22]>(&local_b0,&local_e0,&local_60,(char (*) [22])" is not a valid index")
            ;
            std::__cxx11::string::_M_assign((string *)&status->Error);
LAB_0031100a:
            std::__cxx11::string::~string((string *)&local_b0);
            goto LAB_00311014;
          }
          std::__cxx11::string::append((char *)&value);
          val = local_10c;
          if ((((int)local_10c < 0) && (val = local_10c + (int)uVar6, (int)val < 0)) ||
             (uVar6 <= val)) {
            local_e0.View_._M_len = 7;
            local_e0.View_._M_str = "index: ";
            cmAlphaNum::cmAlphaNum(&local_60,val);
            local_68 = uVar6 - 1;
            cmStrCat<char[17],unsigned_long,char[3],unsigned_long,char[2]>
                      (&local_b0,&local_e0,&local_60,(char (*) [17])" out of range (-",&nitem,
                       (char (*) [3])0x6361f9,&local_68,(char (*) [2])0x6530a8);
            std::__cxx11::string::_M_assign((string *)&status->Error);
            goto LAB_0031100a;
          }
          std::__cxx11::string::append((string *)&value);
          uVar5 = uVar5 + 1;
          lVar7 = lVar7 + 0x20;
        }
        value_01._M_str = value._M_dataplus._M_p;
        value_01._M_len = value._M_string_length;
        cmMakefile::AddDefinition(status->Makefile,name,value_01);
LAB_00311014:
        std::__cxx11::string::~string((string *)&value);
      }
    }
    else {
      bVar3 = true;
      value_00._M_str = "NOTFOUND";
      value_00._M_len = 8;
      cmMakefile::AddDefinition(status->Makefile,name,value_00);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&varArgsExpanded);
  }
  return bVar3;
}

Assistant:

bool HandleGetCommand(std::vector<std::string> const& args,
                      cmExecutionStatus& status)
{
  static std::map<cm::string_view,
                  std::function<cmCMakePath(const cmCMakePath&, bool)>> const
    actions{ { "ROOT_NAME"_s,
               [](const cmCMakePath& path, bool) -> cmCMakePath {
                 return path.GetRootName();
               } },
             { "ROOT_DIRECTORY"_s,
               [](const cmCMakePath& path, bool) -> cmCMakePath {
                 return path.GetRootDirectory();
               } },
             { "ROOT_PATH"_s,
               [](const cmCMakePath& path, bool) -> cmCMakePath {
                 return path.GetRootPath();
               } },
             { "FILENAME"_s,
               [](const cmCMakePath& path, bool) -> cmCMakePath {
                 return path.GetFileName();
               } },
             { "EXTENSION"_s,
               [](const cmCMakePath& path, bool last_only) -> cmCMakePath {
                 if (last_only) {
                   return path.GetExtension();
                 }
                 return path.GetWideExtension();
               } },
             { "STEM"_s,
               [](const cmCMakePath& path, bool last_only) -> cmCMakePath {
                 if (last_only) {
                   return path.GetStem();
                 }
                 return path.GetNarrowStem();
               } },
             { "RELATIVE_PART"_s,
               [](const cmCMakePath& path, bool) -> cmCMakePath {
                 return path.GetRelativePath();
               } },
             { "PARENT_PATH"_s,
               [](const cmCMakePath& path, bool) -> cmCMakePath {
                 return path.GetParentPath();
               } } };

  if (args.size() < 4) {
    status.SetError("GET must be called with at least three arguments.");
    return false;
  }

  const auto& action = args[2];

  if (actions.find(action) == actions.end()) {
    status.SetError(
      cmStrCat("GET called with an unknown action: ", action, "."));
    return false;
  }

  struct Arguments
  {
    bool LastOnly = false;
  };

  CMakePathArgumentParser<Arguments> parser;
  if ((action == "EXTENSION"_s || action == "STEM"_s)) {
    parser.Bind("LAST_ONLY"_s, &Arguments::LastOnly);
  }

  Arguments const arguments = parser.Parse<3>(args);

  if (parser.GetInputs().size() != 1) {
    status.SetError("GET called with unexpected arguments.");
    return false;
  }
  if (parser.GetInputs().front().empty()) {
    status.SetError("Invalid name for output variable.");
    return false;
  }

  std::string path;
  if (!getInputPath(args[1], status, path)) {
    return false;
  }

  auto result = actions.at(action)(path, arguments.LastOnly);

  status.GetMakefile().AddDefinition(parser.GetInputs().front(),
                                     result.String());

  return true;
}